

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::readOptions(Highs *this,string *filename)

{
  HighsLoadOptionsStatus HVar1;
  HighsStatus HVar2;
  string sStack_98;
  HighsLogOptions report_log_options;
  
  if (filename->_M_string_length == 0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kWarning,
                 "Empty file name so not reading options\n");
    HVar2 = kWarning;
  }
  else {
    HighsLogOptions::HighsLogOptions
              (&report_log_options,&(this->options_).super_HighsOptionsStruct.log_options);
    std::__cxx11::string::string((string *)&sStack_98,(string *)filename);
    HVar1 = loadOptionsFromFile(&report_log_options,&this->options_,&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
    HVar2 = kError;
    if ((HVar1 != kError) && (HVar1 != kEmpty)) {
      HVar2 = optionChangeAction(this);
    }
    std::_Function_base::~_Function_base(&report_log_options.user_callback.super__Function_base);
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::readOptions(const std::string& filename) {
  if (filename.size() <= 0) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Empty file name so not reading options\n");
    return HighsStatus::kWarning;
  }
  HighsLogOptions report_log_options = options_.log_options;
  switch (loadOptionsFromFile(report_log_options, options_, filename)) {
    case HighsLoadOptionsStatus::kError:
    case HighsLoadOptionsStatus::kEmpty:
      return HighsStatus::kError;
    default:
      break;
  }
  return optionChangeAction();
}